

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O0

vec4 vec4_create(float x,float y,float z,float w)

{
  vec4 vVar1;
  float w_local;
  float z_local;
  float y_local;
  float x_local;
  vec4 v;
  
  vVar1.y = y;
  vVar1.x = x;
  vVar1.z = z;
  vVar1.w = w;
  return vVar1;
}

Assistant:

vec4 vec4_create(float x, float y, float z, float w) {
    vec4 v;
    v.x = x;
    v.y = y;
    v.z = z;
    v.w = w;
    return v;
}